

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

int lws_protocol_init_vhost(lws_vhost *vh,int *any)

{
  lws_protocol_vhost_options **pplVar1;
  void *ptr;
  bool bVar2;
  int iVar3;
  lws_protocol_vhost_options *plVar4;
  char *__s1;
  long lVar5;
  char *pcVar6;
  lws local_4c8;
  
  memset(&local_4c8.a.opaque_user_data,0,0x480);
  local_4c8.a.context = vh->context;
  if (0 < vh->count_protocols) {
    pplVar1 = &vh->pvo;
    lVar5 = 0;
    local_4c8.a.vhost = vh;
    do {
      local_4c8.a.protocol = vh->protocols + lVar5;
      pcVar6 = vh->protocols[lVar5].name;
      plVar4 = (lws_protocol_vhost_options *)pplVar1;
      if (pcVar6 != (char *)0x0) {
        do {
          plVar4 = plVar4->next;
          if (plVar4 == (lws_protocol_vhost_options *)0x0) {
            _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                        "not instantiating %s",pcVar6);
            goto LAB_00124177;
          }
          iVar3 = strcmp(plVar4->name,pcVar6);
        } while (iVar3 != 0);
        for (plVar4 = plVar4->options; plVar4 != (lws_protocol_vhost_options *)0x0;
            plVar4 = plVar4->next) {
          pcVar6 = plVar4->name;
          _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                      "protocol \"%s\", option \"%s\"",vh->protocols[lVar5].name,pcVar6);
          __s1 = plVar4->name;
          iVar3 = strcmp(__s1,"default");
          if (iVar3 == 0) {
            _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                        "Setting default protocol to %s",vh->protocols[lVar5].name,pcVar6);
            vh->default_protocol_index = (uchar)lVar5;
            __s1 = plVar4->name;
          }
          iVar3 = strcmp(__s1,"raw");
          if (iVar3 == 0) {
            _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                        "Setting raw protocol to %s",vh->protocols[lVar5].name,pcVar6);
            vh->raw_protocol_index = (uchar)lVar5;
          }
        }
LAB_00124177:
        if (any != (int *)0x0) {
          *any = *any | (uint)((vh->tls).ssl_ctx != (lws_tls_ctx *)0x0);
        }
        pcVar6 = vh->protocols[lVar5].name;
        plVar4 = (lws_protocol_vhost_options *)pplVar1;
        if (pcVar6 == (char *)0x0) {
LAB_001241c7:
          if (*pplVar1 != (lws_protocol_vhost_options *)0x0) goto LAB_00124240;
          bVar2 = true;
          plVar4 = (lws_protocol_vhost_options *)0x0;
        }
        else {
          do {
            plVar4 = plVar4->next;
            if (plVar4 == (lws_protocol_vhost_options *)0x0) goto LAB_001241c7;
            iVar3 = strcmp(plVar4->name,pcVar6);
          } while (iVar3 != 0);
          bVar2 = false;
        }
        _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                    "init %s.%s",vh->name,pcVar6);
        if (bVar2) {
          plVar4 = (lws_protocol_vhost_options *)0x0;
        }
        else {
          plVar4 = plVar4->options;
        }
        iVar3 = (*vh->protocols[lVar5].callback)
                          (&local_4c8,LWS_CALLBACK_PROTOCOL_INIT,(void *)0x0,plVar4,0);
        if (iVar3 != 0) {
          if ((vh->protocol_vh_privs != (void **)0x0) &&
             (ptr = vh->protocol_vh_privs[lVar5], ptr != (void *)0x0)) {
            lws_realloc(ptr,0,"lws_free");
            vh->protocol_vh_privs[lVar5] = (void *)0x0;
          }
          _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,1,"lws_protocol_init_vhost",
                      "protocol %s failed init",vh->protocols[lVar5].name,pcVar6);
          return 1;
        }
      }
LAB_00124240:
      lVar5 = lVar5 + 1;
    } while (lVar5 < vh->count_protocols);
  }
  vh->field_0x368 = vh->field_0x368 | 2;
  return 0;
}

Assistant:

int
lws_protocol_init_vhost(struct lws_vhost *vh, int *any)
{
	const struct lws_protocol_vhost_options *pvo, *pvo1;
	int n;
#if defined(LWS_PLAT_FREERTOS)
	struct lws_a _lwsa, *lwsa = &_lwsa;

	memset(&_lwsa, 0, sizeof(_lwsa));
#else
	struct lws _lws;
	struct lws_a *lwsa = &_lws.a;

	memset(&_lws, 0, sizeof(_lws));
#endif

	lwsa->context = vh->context;
	lwsa->vhost = vh;

	/* initialize supported protocols on this vhost */

	for (n = 0; n < vh->count_protocols; n++) {
		lwsa->protocol = &vh->protocols[n];
		if (!vh->protocols[n].name)
			continue;
		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);
		if (pvo) {
			/*
			 * linked list of options specific to
			 * vh + protocol
			 */
			pvo1 = pvo;
			pvo = pvo1->options;

			while (pvo) {
				lwsl_vhost_debug(vh, "protocol \"%s\", "
						     "option \"%s\"",
						     vh->protocols[n].name,
						     pvo->name);

				if (!strcmp(pvo->name, "default")) {
					lwsl_vhost_info(vh, "Setting default "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->default_protocol_index = (unsigned char)n;
				}
				if (!strcmp(pvo->name, "raw")) {
					lwsl_vhost_info(vh, "Setting raw "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->raw_protocol_index = (unsigned char)n;
				}
				pvo = pvo->next;
			}
		} else
			lwsl_vhost_debug(vh, "not instantiating %s",
					     vh->protocols[n].name);

#if defined(LWS_WITH_TLS)
		if (any)
			*any |= !!vh->tls.ssl_ctx;
#endif

		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);

		/*
		 * inform all the protocols that they are doing their
		 * one-time initialization if they want to.
		 *
		 * NOTE the fakewsi is garbage, except the key pointers that are
		 * prepared in case the protocol handler wants to touch them
		 */

		if (pvo
#if !defined(LWS_WITH_PLUGINS)
				/*
				 * with plugins, you have to explicitly
				 * instantiate them per-vhost with pvos.
				 *
				 * Without plugins, not setting the vhost pvo
				 * list at creation enables all the protocols
				 * by default, for backwards compatibility
				 */
				|| !vh->pvo
#endif
		) {
			lwsl_vhost_info(vh, "init %s.%s", vh->name,
					vh->protocols[n].name);
			if (vh->protocols[n].callback((struct lws *)lwsa,
				LWS_CALLBACK_PROTOCOL_INIT, NULL,
#if !defined(LWS_WITH_PLUGINS)
				(void *)(pvo ? pvo->options : NULL),
#else
				(void *)pvo->options,
#endif
				0)) {
				if (vh->protocol_vh_privs && vh->protocol_vh_privs[n]) {
					lws_free(vh->protocol_vh_privs[n]);
					vh->protocol_vh_privs[n] = NULL;
				}
			lwsl_vhost_err(vh, "protocol %s failed init",
					vh->protocols[n].name);

				return 1;
			}
		}
	}

	vh->created_vhost_protocols = 1;

	return 0;
}